

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts3HashInsertElement(Fts3Hash *pH,_fts3ht *pEntry,Fts3HashElem *pNew)

{
  Fts3HashElem *pFVar1;
  Fts3HashElem *pFVar2;
  Fts3HashElem **ppFVar3;
  
  pFVar1 = pEntry->chain;
  if (pFVar1 == (Fts3HashElem *)0x0) {
    pFVar1 = pH->first;
    pNew->next = pFVar1;
    if (pFVar1 != (Fts3HashElem *)0x0) {
      pFVar1->prev = pNew;
    }
    ppFVar3 = &pH->first;
    pNew->prev = (Fts3HashElem *)0x0;
  }
  else {
    pNew->next = pFVar1;
    ppFVar3 = &pFVar1->prev;
    pNew->prev = pFVar1->prev;
    pFVar2 = (Fts3HashElem *)&pH->first;
    if (pFVar1->prev != (Fts3HashElem *)0x0) {
      pFVar2 = pFVar1->prev;
    }
    pFVar2->next = pNew;
  }
  *ppFVar3 = pNew;
  pEntry->count = pEntry->count + 1;
  pEntry->chain = pNew;
  return;
}

Assistant:

static void fts3HashInsertElement(
  Fts3Hash *pH,            /* The complete hash table */
  struct _fts3ht *pEntry,  /* The entry into which pNew is inserted */
  Fts3HashElem *pNew       /* The element to be inserted */
){
  Fts3HashElem *pHead;     /* First element already in pEntry */
  pHead = pEntry->chain;
  if( pHead ){
    pNew->next = pHead;
    pNew->prev = pHead->prev;
    if( pHead->prev ){ pHead->prev->next = pNew; }
    else             { pH->first = pNew; }
    pHead->prev = pNew;
  }else{
    pNew->next = pH->first;
    if( pH->first ){ pH->first->prev = pNew; }
    pNew->prev = 0;
    pH->first = pNew;
  }
  pEntry->count++;
  pEntry->chain = pNew;
}